

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

string * custom_text(string *text,int color)

{
  int in_EDX;
  undefined4 in_register_00000034;
  __cxx11 local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [40];
  undefined8 uStack_18;
  int color_local;
  string *text_local;
  
  uStack_18 = CONCAT44(in_register_00000034,color);
  text_local = text;
  std::__cxx11::to_string(local_a0,in_EDX);
  std::operator+((char *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\x1b[38;5;");
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,local_60);
  std::operator+(text,(char *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)local_a0);
  return text;
}

Assistant:

string custom_text(string text,int color){
	return "\033[38;5;"+to_string(color)+"m" + text + "\033[37m";
	}